

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall CStorage::FindDataDir(CStorage *this)

{
  int iVar1;
  int iVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  int i;
  int DirsCount;
  char aBuf [128];
  char *aDirs [7];
  char aBaseDir [512];
  char *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  char *dst;
  char local_2c8 [128];
  undefined8 local_248 [2];
  undefined1 local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dst = in_RDI;
  iVar1 = fs_is_dir(in_RDI);
  if (iVar1 == 0) {
    iVar1 = fs_is_dir(in_RDI);
    if (iVar1 == 0) {
      str_copy(in_RDI,in_stack_fffffffffffffd18,0);
      str_format(in_RDI + 0x2014,0x200,"%s/data",local_208);
      str_append(dst,(char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 (int)((ulong)in_RDI >> 0x20));
      iVar1 = fs_is_dir(in_RDI);
      if (iVar1 == 0) {
        in_RDI[0x2014] = '\0';
        memcpy(local_248,&PTR_anon_var_dwarf_54720_00185d50,0x38);
        for (iVar1 = 0; iVar1 < 7; iVar1 = iVar1 + 1) {
          str_format(local_2c8,0x80,"%s/mapres",local_248[iVar1]);
          iVar2 = fs_is_dir(in_RDI);
          if (iVar2 != 0) {
            str_copy(in_RDI,in_stack_fffffffffffffd18,0);
            goto LAB_0015fb1f;
          }
        }
        dbg_msg("storage","warning no data directory found");
      }
    }
    else {
      str_copy(in_RDI,in_stack_fffffffffffffd18,0);
    }
  }
  else {
    str_copy(in_RDI,in_stack_fffffffffffffd18,0);
  }
LAB_0015fb1f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FindDataDir()
	{
		// 1) use data-dir in PWD if present
		if(fs_is_dir("data/mapres"))
		{
			str_copy(m_aDataDir, "data", sizeof(m_aDataDir));
			return;
		}

		// 2) use compiled-in data-dir if present
		if(fs_is_dir(DATA_DIR "/mapres"))
		{
			str_copy(m_aDataDir, DATA_DIR, sizeof(m_aDataDir));
			return;
		}

		// 3) check for usable path in argv[0]
		{
			char aBaseDir[IO_MAX_PATH_LENGTH];
			str_copy(aBaseDir, m_aAppDir, sizeof(aBaseDir));
			str_format(m_aDataDir, sizeof(m_aDataDir), "%s/data", aBaseDir);
			str_append(aBaseDir, "/data/mapres", sizeof(aBaseDir));

			if(fs_is_dir(aBaseDir))
				return;
			else
				m_aDataDir[0] = 0;
		}

	#if defined(CONF_FAMILY_UNIX)
		// 4) check for all default locations
		{
			const char *aDirs[] = {
				"/usr/share/teeworlds/data",
				"/usr/share/games/teeworlds/data",
				"/usr/local/share/teeworlds/data",
				"/usr/local/share/games/teeworlds/data",
				"/usr/pkg/share/teeworlds/data",
				"/usr/pkg/share/games/teeworlds/data",
				"/opt/teeworlds/data"
			};
			const int DirsCount = sizeof(aDirs) / sizeof(aDirs[0]);

			int i;
			for (i = 0; i < DirsCount; i++)
			{
				char aBuf[128];
				str_format(aBuf, sizeof(aBuf), "%s/mapres", aDirs[i]);
				if(fs_is_dir(aBuf))
				{
					str_copy(m_aDataDir, aDirs[i], sizeof(m_aDataDir));
					return;
				}
			}
		}
	#endif

		// no data-dir found
		dbg_msg("storage", "warning no data directory found");
	}